

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upgrade_memory_model.cpp
# Opt level: O2

void __thiscall
spvtools::opt::UpgradeMemoryModel::UpgradeExtInst(UpgradeMemoryModel *this,Instruction *ext_inst)

{
  IRContext *this_00;
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t id;
  DefUseManager *pDVar3;
  Instruction *pIVar4;
  TypeManager *pTVar5;
  Type *pTVar6;
  Instruction *insert_before;
  initializer_list<unsigned_int> init_list;
  initializer_list<unsigned_int> init_list_00;
  uint local_118;
  uint32_t local_114;
  uint32_t local_110;
  uint32_t local_10c;
  SmallVector<unsigned_int,_2UL> local_108;
  InstructionBuilder builder;
  vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
  element_types;
  Struct struct_type;
  
  uVar1 = Instruction::GetSingleWordInOperand(ext_inst,1);
  uVar2 = Instruction::GetSingleWordInOperand(ext_inst,3);
  local_10c = uVar2;
  pDVar3 = Pass::get_def_use_mgr(&this->super_Pass);
  pIVar4 = analysis::DefUseManager::GetDef(pDVar3,uVar2);
  uVar2 = Instruction::type_id(pIVar4);
  pDVar3 = Pass::get_def_use_mgr(&this->super_Pass);
  pIVar4 = analysis::DefUseManager::GetDef(pDVar3,uVar2);
  uVar2 = Instruction::GetSingleWordInOperand(pIVar4,1);
  local_110 = uVar2;
  id = Instruction::type_id(ext_inst);
  local_114 = id;
  std::
  vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
  ::vector(&element_types,2,(allocator_type *)&struct_type);
  pTVar5 = IRContext::get_type_mgr((this->super_Pass).context_);
  pTVar6 = analysis::TypeManager::GetType(pTVar5,id);
  *element_types.
   super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
   ._M_impl.super__Vector_impl_data._M_start = pTVar6;
  pTVar5 = IRContext::get_type_mgr((this->super_Pass).context_);
  pTVar6 = analysis::TypeManager::GetType(pTVar5,uVar2);
  element_types.
  super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
  ._M_impl.super__Vector_impl_data._M_start[1] = pTVar6;
  analysis::Struct::Struct(&struct_type,&element_types);
  pTVar5 = IRContext::get_type_mgr((this->super_Pass).context_);
  uVar2 = analysis::TypeManager::GetTypeInstruction(pTVar5,&struct_type.super_Type);
  builder.context_._0_4_ = (uint)(uVar1 != 0x23) << 4 | 0x24;
  init_list._M_len = 1;
  init_list._M_array = (iterator)&builder;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_108,init_list);
  Instruction::SetOperand(ext_inst,3,&local_108);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_108);
  Instruction::RemoveOperand(ext_inst,5);
  Instruction::SetResultType(ext_inst,uVar2);
  pIVar4 = (ext_inst->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
  insert_before = (Instruction *)0x0;
  if ((pIVar4->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ == false) {
    insert_before = pIVar4;
  }
  InstructionBuilder::InstructionBuilder
            (&builder,(this->super_Pass).context_,insert_before,
             kAnalysisInstrToBlockMapping|kAnalysisBegin);
  uVar1 = Instruction::result_id(ext_inst);
  local_118 = 0;
  local_108._vptr_SmallVector = (_func_int **)0x0;
  local_108.size_ = 0;
  local_108.buffer[0].data._M_elems = (array<signed_char,_4UL>)0x0;
  local_108.buffer[1].data._M_elems = (array<signed_char,_4UL>)0x0;
  std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_range_initialize<unsigned_int_const*>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_108,&local_118);
  pIVar4 = InstructionBuilder::AddCompositeExtract
                     (&builder,local_114,uVar1,
                      (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_108);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_108);
  this_00 = (this->super_Pass).context_;
  uVar1 = Instruction::result_id(ext_inst);
  uVar2 = Instruction::result_id(pIVar4);
  IRContext::ReplaceAllUsesWith(this_00,uVar1,uVar2);
  local_118 = Instruction::result_id(ext_inst);
  init_list_00._M_len = 1;
  init_list_00._M_array = &local_118;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_108,init_list_00);
  Instruction::SetInOperand(pIVar4,0,&local_108);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_108);
  uVar1 = Instruction::result_id(ext_inst);
  local_118 = 1;
  local_108._vptr_SmallVector = (_func_int **)0x0;
  local_108.size_ = 0;
  local_108.buffer[0].data._M_elems = (array<signed_char,_4UL>)0x0;
  local_108.buffer[1].data._M_elems = (array<signed_char,_4UL>)0x0;
  std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_range_initialize<unsigned_int_const*>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_108,&local_118,&local_114);
  pIVar4 = InstructionBuilder::AddCompositeExtract
                     (&builder,local_110,uVar1,
                      (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_108);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_108);
  uVar1 = Instruction::result_id(pIVar4);
  InstructionBuilder::AddStore(&builder,local_10c,uVar1);
  analysis::Struct::~Struct(&struct_type);
  std::
  _Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
  ::~_Vector_base(&element_types.
                   super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
                 );
  return;
}

Assistant:

void UpgradeMemoryModel::UpgradeExtInst(Instruction* ext_inst) {
  const bool is_modf = ext_inst->GetSingleWordInOperand(1u) == GLSLstd450Modf;
  auto ptr_id = ext_inst->GetSingleWordInOperand(3u);
  auto ptr_type_id = get_def_use_mgr()->GetDef(ptr_id)->type_id();
  auto pointee_type_id =
      get_def_use_mgr()->GetDef(ptr_type_id)->GetSingleWordInOperand(1u);
  auto element_type_id = ext_inst->type_id();
  std::vector<const analysis::Type*> element_types(2);
  element_types[0] = context()->get_type_mgr()->GetType(element_type_id);
  element_types[1] = context()->get_type_mgr()->GetType(pointee_type_id);
  analysis::Struct struct_type(element_types);
  uint32_t struct_id =
      context()->get_type_mgr()->GetTypeInstruction(&struct_type);
  // Change the operation
  GLSLstd450 new_op = is_modf ? GLSLstd450ModfStruct : GLSLstd450FrexpStruct;
  ext_inst->SetOperand(3u, {static_cast<uint32_t>(new_op)});
  // Remove the pointer argument
  ext_inst->RemoveOperand(5u);
  // Set the type id to the new struct.
  ext_inst->SetResultType(struct_id);

  // The result is now a struct of the original result. The zero'th element is
  // old result and should replace the old result. The one'th element needs to
  // be stored via a new instruction.
  auto where = ext_inst->NextNode();
  InstructionBuilder builder(
      context(), where,
      IRContext::kAnalysisDefUse | IRContext::kAnalysisInstrToBlockMapping);
  auto extract_0 =
      builder.AddCompositeExtract(element_type_id, ext_inst->result_id(), {0});
  context()->ReplaceAllUsesWith(ext_inst->result_id(), extract_0->result_id());
  // The extract's input was just changed to itself, so fix that.
  extract_0->SetInOperand(0u, {ext_inst->result_id()});
  auto extract_1 =
      builder.AddCompositeExtract(pointee_type_id, ext_inst->result_id(), {1});
  builder.AddStore(ptr_id, extract_1->result_id());
}